

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

GenericResponseSentHandler * __thiscall
anon_unknown.dwarf_2c80290::Impl::EventHandlers::responseSent
          (GenericResponseSentHandler *__return_storage_ptr__,EventHandlers *this,TypeInfo *typeinfo
          )

{
  iterator iVar1;
  GenericResponseSentHandler *extraout_RAX;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  TypeInfo *local_28;
  
  local_38._M_device = &this->responseSentMutex;
  local_38._M_owns = false;
  local_28 = typeinfo;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  iVar1 = std::
          _Hashtable<const_dap::TypeInfo_*,_std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_std::allocator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<const_dap::TypeInfo_*>,_std::hash<const_dap::TypeInfo_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->responseSentMap)._M_h,&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    std::function<void_(const_void_*,_const_dap::Error_*)>::function
              (__return_storage_ptr__,
               (function<void_(const_void_*,_const_dap::Error_*)> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false>
                      ._M_cur + 0x10));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return extraout_RAX;
}

Assistant:

GenericResponseSentHandler responseSent(const dap::TypeInfo* typeinfo) {
      std::unique_lock<std::mutex> lock(responseSentMutex);
      auto it = responseSentMap.find(typeinfo);
      return (it != responseSentMap.end()) ? it->second
                                           : decltype(it->second){};
    }